

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection.cpp
# Opt level: O0

void flatbuffers::SetString
               (Schema *schema,string *val,String *str,
               vector<unsigned_char,_std::allocator<unsigned_char>_> *flatbuf,Object *root_table)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uchar *puVar5;
  void *__src;
  long lVar6;
  ulong uVar7;
  undefined1 local_78 [8];
  ResizeContext ctx;
  uoffset_t start;
  uoffset_t str_start;
  int delta;
  Object *root_table_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *flatbuf_local;
  String *str_local;
  string *val_local;
  Schema *schema_local;
  
  iVar1 = std::__cxx11::string::size();
  uVar2 = Vector<char,_unsigned_int>::size(&str->super_Vector<char,_unsigned_int>);
  puVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(flatbuf);
  uVar3 = (int)str - (int)puVar5;
  ctx.dag_check_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = uVar3 + 4;
  if (iVar1 - uVar2 != 0) {
    puVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(flatbuf);
    uVar7 = (ulong)ctx.dag_check_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
    uVar4 = Vector<char,_unsigned_int>::size(&str->super_Vector<char,_unsigned_int>);
    memset(puVar5 + uVar7,0,(ulong)uVar4);
    ResizeContext::ResizeContext
              ((ResizeContext *)local_78,schema,
               ctx.dag_check_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,iVar1 - uVar2,flatbuf,
               root_table);
    puVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(flatbuf);
    uVar2 = std::__cxx11::string::size();
    WriteScalar<unsigned_int>(puVar5 + uVar3,uVar2);
    ResizeContext::~ResizeContext((ResizeContext *)local_78);
  }
  puVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(flatbuf);
  uVar7 = (ulong)ctx.dag_check_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
  __src = (void *)std::__cxx11::string::c_str();
  lVar6 = std::__cxx11::string::size();
  memcpy(puVar5 + uVar7,__src,lVar6 + 1);
  return;
}

Assistant:

void SetString(const reflection::Schema &schema, const std::string &val,
               const String *str, std::vector<uint8_t> *flatbuf,
               const reflection::Object *root_table) {
  auto delta = static_cast<int>(val.size()) - static_cast<int>(str->size());
  auto str_start = static_cast<uoffset_t>(
      reinterpret_cast<const uint8_t *>(str) - flatbuf->data());
  auto start = str_start + static_cast<uoffset_t>(sizeof(uoffset_t));
  if (delta) {
    // Clear the old string, since we don't want parts of it remaining.
    memset(flatbuf->data() + start, 0, str->size());
    // Different size, we must expand (or contract).
    ResizeContext ctx(schema, start, delta, flatbuf, root_table);
    // Set the new length.
    WriteScalar(flatbuf->data() + str_start,
                static_cast<uoffset_t>(val.size()));
  }
  // Copy new data. Safe because we created the right amount of space.
  memcpy(flatbuf->data() + start, val.c_str(), val.size() + 1);
}